

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_7a45aa::TransformActionStrip::operator()
          (string *__return_storage_ptr__,TransformActionStrip *this,string *s)

{
  TransformSelector *pTVar1;
  int iVar2;
  string_view str;
  
  pTVar1 = (this->super_TransformAction).Selector;
  iVar2 = (*(pTVar1->super_TransformSelector)._vptr_TransformSelector[4])(pTVar1,s);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    str._M_str = (s->_M_dataplus)._M_p;
    str._M_len = s->_M_string_length;
    cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string& s) override
  {
    if (this->Selector->InSelection(s)) {
      return cmTrimWhitespace(s);
    }

    return s;
  }